

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logreplay.c
# Opt level: O0

int replay_display_objects(nh_objitem *items,int icount,char *title,int how,nh_objresult *pick_list)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  char *pcStack_58;
  boolean id_ok;
  char *resultbuf;
  char *token;
  int count;
  int id;
  int j;
  int i;
  nh_objresult *pick_list_local;
  char *pcStack_28;
  int how_local;
  char *title_local;
  nh_objitem *pnStack_18;
  int icount_local;
  nh_objitem *items_local;
  
  if ((how == 0) || (how == -1)) {
    items_local._4_4_ = 0;
  }
  else {
    _j = pick_list;
    pick_list_local._4_4_ = how;
    pcStack_28 = title;
    title_local._4_4_ = icount;
    pnStack_18 = items;
    pcVar4 = next_log_token();
    if ((pcVar4 == (char *)0x0) || (*pcVar4 != 'o')) {
      parse_error("Bad object menu data");
    }
    pcStack_58 = pcVar4 + 3;
    if (pcVar4[2] == 'x') {
      items_local._4_4_ = -1;
    }
    else {
      id = 0;
      while( true ) {
        token._0_4_ = -1;
        iVar3 = __isoc99_sscanf(pcStack_58,"%x,%x:",(long)&token + 4,&token);
        if (iVar3 == 0) break;
        bVar2 = false;
        count = 0;
        while( true ) {
          bVar1 = false;
          if (count < title_local._4_4_) {
            bVar1 = (bool)(bVar2 ^ 1);
          }
          if (!bVar1) break;
          if (pnStack_18[count].id == token._4_4_) {
            bVar2 = true;
          }
          count = count + 1;
        }
        if (!bVar2) {
          parse_error("Invalid menu id in object menu data");
        }
        _j[id].id = token._4_4_;
        _j[id].count = (int)token;
        id = id + 1;
        pcStack_58 = strchr(pcStack_58,0x3a);
        pcStack_58 = pcStack_58 + 1;
      }
      items_local._4_4_ = id;
    }
  }
  return items_local._4_4_;
}

Assistant:

static int replay_display_objects(struct nh_objitem *items, int icount, const char *title,
			int how, struct nh_objresult *pick_list)
{
    int i, j, id, count;
    char *token;
    char *resultbuf;
    boolean id_ok;
    
    if (how == PICK_NONE || how == PICK_INVACTION)
	return 0;
    
    token = next_log_token();
    if (!token || token[0] != 'o')
	parse_error("Bad object menu data");
    resultbuf = token + 2;
    
    if (*resultbuf++ == 'x')
	return -1;
    
    i = 0;
    count = -1;
    while (sscanf(resultbuf, "%x,%x:", &id, &count)) {
	/* make sure all ids are valid - program changes could have broken the save */
	id_ok  = FALSE;
	for (j = 0; j < icount && !id_ok; j++)
	    if (items[j].id == id)
		id_ok = TRUE;
	if (!id_ok)
	    parse_error("Invalid menu id in object menu data");
	
	pick_list[i].id = id;
	pick_list[i].count = count;
	i++;
	resultbuf = strchr(resultbuf, ':') + 1;
	count = -1;
    }

    return i;
}